

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

value_t __thiscall
remove_edges_filtration::compute_filtration
          (remove_edges_filtration *this,unsigned_short dimension,
          directed_flag_complex_cell_t *param_2,filtered_directed_graph_t *param_3,
          value_t *boundary_filtration)

{
  runtime_error *this_00;
  long lVar1;
  int iVar2;
  undefined6 in_register_00000032;
  float fVar3;
  float fVar4;
  
  fVar3 = 0.0;
  iVar2 = (int)CONCAT62(in_register_00000032,dimension);
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Please provide a graph with random weights on the edges.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = 0;
    fVar4 = 0.0;
    do {
      fVar3 = boundary_filtration[lVar1];
      if ((lVar1 != 0) && (fVar3 <= fVar4)) {
        fVar3 = fVar4;
      }
      lVar1 = lVar1 + 1;
      fVar4 = fVar3;
    } while ((ulong)dimension + 1 != lVar1);
  }
  return fVar3;
}

Assistant:

virtual inline value_t compute_filtration(unsigned short dimension, const directed_flag_complex_cell_t&,
	                                          const filtered_directed_graph_t&,
	                                          const value_t* boundary_filtration) const {

		if (dimension == 0) { return (0.0f); }

		if (dimension == 1) { throw std::runtime_error("Please provide a graph with random weights on the edges."); }
		return (max(boundary_filtration, 0, dimension));
	}